

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_>::handleOccurrence
          (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *this,uint pos,
          StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  parser_data_type Val;
  bool local_19;
  
  local_19 = false;
  bVar1 = parser<bool>::parse((parser<bool> *)this,&this->super_Option,ArgName,Arg,&local_19);
  if (!bVar1) {
    opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>::check_location
              (&this->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>);
    anon_unknown.dwarf_1408b8::HelpPrinter::operator=
              ((this->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>).Location,
               local_19);
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }